

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basetableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::BaseTableRef::Copy(BaseTableRef *this)

{
  _Alloc_hider __p;
  pointer pBVar1;
  type target;
  pointer *__ptr;
  TableRef *in_RSI;
  unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>_> local_28;
  _Alloc_hider local_20;
  
  make_uniq<duckdb::BaseTableRef>();
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->catalog_name);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->schema_name);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->table_name);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_28);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pBVar1->super_TableRef).column_name_alias,
              &(in_RSI->column_name_alias).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  if (in_RSI[1].column_name_alias.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_20._M_p = (pointer)0x0;
  }
  else {
    unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true>::operator->
              ((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *)
               &in_RSI[1].column_name_alias.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    AtClause::Copy((AtClause *)&stack0xffffffffffffffe0);
  }
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_28);
  __p._M_p = local_20._M_p;
  local_20._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>::reset
            ((__uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> *)
             &pBVar1->at_clause,(pointer)__p._M_p);
  ::std::unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>::~unique_ptr
            ((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> *)
             &stack0xffffffffffffffe0);
  target = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator*((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                      *)&local_28);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_28._M_t.
       super___uniq_ptr_impl<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>.
       super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> BaseTableRef::Copy() {
	auto copy = make_uniq<BaseTableRef>();

	copy->catalog_name = catalog_name;
	copy->schema_name = schema_name;
	copy->table_name = table_name;
	copy->column_name_alias = column_name_alias;
	copy->at_clause = at_clause ? at_clause->Copy() : nullptr;
	CopyProperties(*copy);

	return std::move(copy);
}